

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void * push_ds(flatcc_builder_t *B,flatbuffers_uoffset_t size)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t offset;
  flatbuffers_uoffset_t size_local;
  flatcc_builder_t *B_local;
  
  uVar1 = B->ds_offset;
  uVar2 = size + B->ds_offset;
  B->ds_offset = uVar2;
  if ((uVar2 < B->ds_limit) ||
     (iVar3 = reserve_ds(B,(ulong)(B->ds_offset + 1),0xfffffffc), iVar3 == 0)) {
    B_local = (flatcc_builder_t *)(B->ds + uVar1);
  }
  else {
    B_local = (flatcc_builder_t *)0x0;
  }
  return B_local;
}

Assistant:

static inline void *push_ds(flatcc_builder_t *B, uoffset_t size)
{
    size_t offset;

    offset = B->ds_offset;
    if ((B->ds_offset += size) >= B->ds_limit) {
        if (reserve_ds(B, B->ds_offset + 1, data_limit)) {
            return 0;
        }
    }
    return B->ds + offset;
}